

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O1

int downsample(double *x,int lenx,int M,double *y)

{
  int iVar1;
  ulong uVar2;
  
  if (M < 0) {
    return -1;
  }
  if (M == 0) {
    if (0 < lenx) {
      uVar2 = 0;
      do {
        y[uVar2] = x[uVar2];
        uVar2 = uVar2 + 1;
      } while ((uint)lenx != uVar2);
    }
  }
  else {
    iVar1 = (lenx + -1) / M;
    lenx = iVar1 + 1;
    if (-1 < iVar1) {
      uVar2 = 0;
      do {
        y[uVar2] = *x;
        uVar2 = uVar2 + 1;
        x = x + (uint)M;
      } while (iVar1 + 1 != uVar2);
      return lenx;
    }
  }
  return lenx;
}

Assistant:

int downsample(double *x,int lenx, int M, double *y) {
	int N,i;

	if (M < 0) {
		return -1;
	}
	if (M == 0) {
		for (i = 0; i < lenx; ++i) {
			y[i] = x[i];
		}
		return lenx;
	}

	N = (lenx-1)/M + 1;

	for (i = 0;i < N;++i) {
		y[i] = x[i*M];
	}

	return N;
}